

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::add_dependency(FileDescriptorProto *this,string *value)

{
  int iVar1;
  Arena *this_00;
  string *elem;
  int iVar2;
  Rep *pRVar3;
  
  pRVar3 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
    iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.total_size_;
LAB_00581be9:
    internal::RepeatedPtrFieldBase::Reserve
              (&(this->dependency_).super_RepeatedPtrFieldBase,iVar2 + 1);
    pRVar3 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
    iVar2 = pRVar3->allocated_size;
  }
  else {
    iVar1 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
    iVar2 = pRVar3->allocated_size;
    if (iVar1 < iVar2) {
      (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (string *)pRVar3->elements[iVar1];
      goto LAB_00581c7d;
    }
    if (iVar2 == (this->dependency_).super_RepeatedPtrFieldBase.total_size_) goto LAB_00581be9;
  }
  pRVar3->allocated_size = iVar2 + 1;
  this_00 = (this->dependency_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (string *)operator_new(0x20);
    *(string **)elem = elem + 0x10;
    *(long *)(elem + 8) = 0;
    elem[0x10] = (string)0x0;
  }
  else {
    elem = (string *)
           Arena::AllocateAligned(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    *(string **)elem = elem + 0x10;
    *(long *)(elem + 8) = 0;
    elem[0x10] = (string)0x0;
    Arena::AddListNode(this_00,elem,internal::arena_destruct_object<std::__cxx11::string>);
    pRVar3 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
  }
  iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
  pRVar3->elements[iVar2] = elem;
LAB_00581c7d:
  std::__cxx11::string::_M_assign(elem);
  return;
}

Assistant:

inline void FileDescriptorProto::add_dependency(const ::std::string& value) {
  dependency_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:google.protobuf.FileDescriptorProto.dependency)
}